

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O0

float calculateEuclideanDistance(FeatureVec *a,FeatureVec *b)

{
  size_t sVar1;
  size_t sVar2;
  FeatureVec *pFVar3;
  float *pfVar4;
  __type _Var5;
  double dVar6;
  size_t f;
  float dist;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  FeatureVec *this;
  FeatureVec *local_20;
  float local_14;
  
  sVar1 = FeatureVec::size((FeatureVec *)0x10528d);
  sVar2 = FeatureVec::size((FeatureVec *)0x10529c);
  if (sVar1 == sVar2) {
    local_14 = 0.0;
    local_20 = (FeatureVec *)0x0;
    while( true ) {
      this = local_20;
      pFVar3 = (FeatureVec *)FeatureVec::size((FeatureVec *)0x1052f1);
      if (pFVar3 <= this) break;
      pfVar4 = FeatureVec::operator[]
                         (this,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffbc = *pfVar4;
      FeatureVec::operator[](this,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      _Var5 = std::pow<float,int>(0.0,0x10533a);
      local_14 = (float)((double)local_14 + _Var5);
      local_20 = (FeatureVec *)
                 ((long)&(local_20->values).super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
    dVar6 = std::sqrt((double)(ulong)(uint)local_14);
    return SUB84(dVar6,0);
  }
  __assert_fail("a.size() == b.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-km/src/utils/FeatureVec.cpp"
                ,0x2b,"float calculateEuclideanDistance(FeatureVec, FeatureVec)");
}

Assistant:

float calculateEuclideanDistance(FeatureVec a, FeatureVec b) {
  assert(a.size() == b.size());
  float dist = 0.0f;
  // Loop over all features
  for (size_t f = 0; f < a.size(); f++) {
    // Accumulate the squared difference
    dist += std::pow(a[f] - b[f], 2);
  }
  // Return the square root
  return std::sqrt(dist);
}